

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.h
# Opt level: O2

bool __thiscall
dg::vr::ValueRelations::PlainValueIterator::nextViableValue(PlainValueIterator *this)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Self *p_Var3;
  _Base_ptr p_Var4;
  
  p_Var2 = (this->bucketIt)._M_node;
  p_Var4 = (_Base_ptr)(this->valueIt)._M_current;
  while (p_Var1 = p_Var2[1]._M_left, p_Var4 == p_Var1) {
    p_Var3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>
             ::operator++(&this->bucketIt);
    if (p_Var3->_M_node == (this->endIt)._M_node) break;
    p_Var2 = (this->bucketIt)._M_node;
    p_Var4 = p_Var2[1]._M_parent;
    (this->valueIt)._M_current = (Value **)p_Var4;
  }
  return p_Var4 != p_Var1;
}

Assistant:

bool nextViableValue() {
            while (valueIt == bucketIt->second.end()) {
                if (++bucketIt == endIt)
                    return false;
                valueIt = bucketIt->second.begin();
            }
            return true;
        }